

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O3

void Abc_SclSurfaceFree(SC_Surface *p)

{
  float *pfVar1;
  int *piVar2;
  void *pvVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  pfVar1 = (p->vIndex0).pArray;
  if (pfVar1 != (float *)0x0) {
    free(pfVar1);
    (p->vIndex0).pArray = (float *)0x0;
  }
  (p->vIndex0).nCap = 0;
  (p->vIndex0).nSize = 0;
  pfVar1 = (p->vIndex1).pArray;
  if (pfVar1 != (float *)0x0) {
    free(pfVar1);
    (p->vIndex1).pArray = (float *)0x0;
  }
  (p->vIndex1).nCap = 0;
  (p->vIndex1).nSize = 0;
  piVar2 = (p->vIndex0I).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vIndex0I).pArray = (int *)0x0;
  }
  (p->vIndex0I).nCap = 0;
  (p->vIndex0I).nSize = 0;
  piVar2 = (p->vIndex1I).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vIndex1I).pArray = (int *)0x0;
  }
  (p->vIndex1I).nCap = 0;
  (p->vIndex1I).nSize = 0;
  iVar5 = (p->vData).nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar3 = (p->vData).pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar5 = (p->vData).nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  ppvVar4 = (p->vData).pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    (p->vData).pArray = (void **)0x0;
  }
  (p->vData).nCap = 0;
  (p->vData).nSize = 0;
  iVar5 = (p->vDataI).nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar3 = (p->vDataI).pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar5 = (p->vDataI).nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  ppvVar4 = (p->vDataI).pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    (p->vDataI).pArray = (void **)0x0;
  }
  (p->vDataI).nCap = 0;
  (p->vDataI).nSize = 0;
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  return;
}

Assistant:

static inline void Abc_SclSurfaceFree( SC_Surface * p )
{
    Vec_FltErase( &p->vIndex0 );
    Vec_FltErase( &p->vIndex1 );
    Vec_IntErase( &p->vIndex0I );
    Vec_IntErase( &p->vIndex1I );
    Vec_VecErase( (Vec_Vec_t *)&p->vData );
    Vec_VecErase( (Vec_Vec_t *)&p->vDataI );
    ABC_FREE( p->pName );
//    ABC_FREE( p );
}